

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip_packinfo_digests.c
# Opt level: O0

void test_read_format_7zip_packinfo_digests(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  time_t tVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  char *refname;
  archive_conflict *paStack_18;
  char buff [4];
  archive *a;
  archive_entry *ae;
  
  extract_reference_file("test_read_format_7zip_packinfo_digests.7z");
  paStack_18 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                   ,L'$',(uint)(paStack_18 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_xz((archive *)paStack_18);
  if (iVar1 == 0) {
    iVar1 = archive_read_support_filter_all((archive *)paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paStack_18);
    iVar1 = archive_read_support_format_all((archive *)paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paStack_18);
    wVar2 = archive_read_open_filename
                      (paStack_18,"test_read_format_7zip_packinfo_digests.7z",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'.',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",paStack_18);
    iVar1 = archive_read_next_header((archive *)paStack_18,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                        paStack_18);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'3',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
               ,L'4',"a.txt","\"a.txt\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar5 = archive_entry_mtime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'5',0x5dfc3173,"1576808819",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'6',4,"4",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'7',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'8',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",paStack_18);
    lVar7 = archive_read_data((archive *)paStack_18,(void *)((long)&refname + 4),4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'9',4,"4",lVar7,"archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L':',(void *)((long)&refname + 4),"buff","aaa\n","\"aaa\\n\"",4,"4",
                        (void *)0x0);
    iVar1 = archive_read_next_header((archive *)paStack_18,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                        paStack_18);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'?',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
               ,L'@',"b.txt","\"b.txt\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar5 = archive_entry_mtime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'A',0x5dfc3173,"1576808819",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'B',4,"4",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'C',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'D',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",paStack_18);
    lVar7 = archive_read_data((archive *)paStack_18,(void *)((long)&refname + 4),4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'E',4,"4",lVar7,"archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'F',(void *)((long)&refname + 4),"buff","bbb\n","\"bbb\\n\"",4,"4",
                        (void *)0x0);
    iVar1 = archive_file_count((archive *)paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'H',2,"2",(long)iVar1,"archive_file_count(a)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paStack_18,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'L',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                        paStack_18);
    iVar1 = archive_filter_code((archive *)paStack_18,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'P',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                        paStack_18);
    iVar1 = archive_format((archive *)paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'R',0xe0000,"ARCHIVE_FORMAT_7ZIP",(long)iVar1,"archive_format(a)",
                        paStack_18);
    iVar1 = archive_read_close((archive *)paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                        ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                   ,L'&');
    test_skipping("7zip:lzma decoding is not supported on this platform");
  }
  iVar1 = archive_read_free((archive *)paStack_18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip_packinfo_digests.c"
                      ,L'W',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_7zip_packinfo_digests)
{
	struct archive_entry *ae;
	struct archive *a;
	char buff[4];
	const char *refname = "test_read_format_7zip_packinfo_digests.7z";

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	if (ARCHIVE_OK != archive_read_support_filter_xz(a)) {
		skipping("7zip:lzma decoding is not supported on this "
		"platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_filename(a, refname, 10240));

		/* Verify regular file1. */
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
		assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
		assertEqualString("a.txt", archive_entry_pathname(ae));
		assertEqualInt(1576808819, archive_entry_mtime(ae));
		assertEqualInt(4, archive_entry_size(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
		assertEqualInt(4, archive_read_data(a, buff, sizeof(buff)));
		assertEqualMem(buff, "aaa\n", 4);

		/* Verify regular file2. */
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
		assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
		assertEqualString("b.txt", archive_entry_pathname(ae));
		assertEqualInt(1576808819, archive_entry_mtime(ae));
		assertEqualInt(4, archive_entry_size(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
		assertEqualInt(4, archive_read_data(a, buff, sizeof(buff)));
		assertEqualMem(buff, "bbb\n", 4);

		assertEqualInt(2, archive_file_count(a));

		/* End of archive. */
		assertEqualIntA(a, ARCHIVE_EOF,
		    archive_read_next_header(a, &ae));

		/* Verify archive format. */
		assertEqualIntA(a, ARCHIVE_FILTER_NONE,
		    archive_filter_code(a, 0));
		assertEqualIntA(a, ARCHIVE_FORMAT_7ZIP,
		    archive_format(a));

		/* Close the archive. */
		assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}